

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O2

void __thiscall
utFBXImporterExporter_importCubesWithUnicodeDuplicatedNames_Test::TestBody
          (utFBXImporterExporter_importCubesWithUnicodeDuplicatedNames_Test *this)

{
  aiNode *paVar1;
  aiNode *paVar2;
  aiScene *paVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  AssertHelper local_60;
  AssertHelper local_58;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Importer importer;
  
  Assimp::Importer::Importer(&importer);
  paVar3 = Assimp::Importer::ReadFile
                     (&importer,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/FBX/cubes_with_names.fbx"
                      ,0x400);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar5 = paVar3 != (aiScene *)0x0;
  gtest_ar_.success_ = bVar5;
  if (paVar3 == (aiScene *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x636e0b,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x72,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar5 = paVar3->mRootNode == (aiNode *)0x0;
    gtest_ar_.success_ = !bVar5;
    if (bVar5) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"scene->mRootNode",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0x74,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      paVar1 = paVar3->mRootNode;
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"root->mName.C_Str()","\"RootNode\"",(paVar1->mName).data,
                 "RootNode");
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0x76,pcVar4);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
LAB_003685d9:
        this_00 = &gtest_ar.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
        goto LAB_003685f5;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      bVar5 = paVar1->mChildren == (aiNode **)0x0;
      gtest_ar_.success_ = !bVar5;
      if (bVar5) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"root->mChildren",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0x77,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        gtest_ar_.success_ = true;
        gtest_ar_._1_3_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_ar,"root->mNumChildren","2u",&paVar1->mNumChildren,
                   (uint *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                     ,0x78,pcVar4);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
          goto LAB_003685d9;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        paVar2 = *paVar1->mChildren;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = paVar2 != (aiNode *)0x0;
        if (paVar2 == (aiNode *)0x0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"child0","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                     ,0x7b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          testing::internal::CmpHelperSTREQ
                    ((internal *)&gtest_ar,"child0->mName.C_Str()","\"Cube2\"",(paVar2->mName).data,
                     "Cube2");
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                       ,0x7c,pcVar4);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
            goto LAB_003685d9;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          bVar5 = paVar2->mChildren == (aiNode **)0x0;
          gtest_ar_.success_ = !bVar5;
          if (bVar5) {
            testing::Message::Message((Message *)&local_60);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"child0->mChildren","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                       ,0x7d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            gtest_ar_.success_ = true;
            gtest_ar_._1_3_ = 0;
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&gtest_ar,"child0->mNumChildren","1u",&paVar2->mNumChildren,
                       (uint *)&gtest_ar_);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                         ,0x7e,pcVar4);
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
              goto LAB_003685d9;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            paVar2 = *paVar2->mChildren;
            gtest_ar_.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            gtest_ar_.success_ = paVar2 != (aiNode *)0x0;
            if (paVar2 == (aiNode *)0x0) {
              testing::Message::Message((Message *)&local_60);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"child00",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                         ,0x81,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar_.message_);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&gtest_ar,"child00->mName.C_Str()",
                         "\"\\xd0\\x9a\\xd1\\x83\\xd0\\xb1\\x31\"",(paVar2->mName).data,
                         anon_var_dwarf_13a910);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                           ,0x82,pcVar4);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
                goto LAB_003685d9;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              paVar1 = paVar1->mChildren[1];
              gtest_ar_.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              gtest_ar_.success_ = paVar1 != (aiNode *)0x0;
              if (paVar1 == (aiNode *)0x0) {
                testing::Message::Message((Message *)&local_60);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"child1",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_58,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                           ,0x85,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar_.message_);
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,"child1->mName.C_Str()","\"Cube3\"",
                           (paVar1->mName).data,"Cube3");
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                             ,0x86,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
                  goto LAB_003685d9;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                gtest_ar_.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                bVar5 = paVar1->mChildren == (aiNode **)0x0;
                gtest_ar_.success_ = !bVar5;
                if (bVar5) {
                  testing::Message::Message((Message *)&local_60);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)"child1->mChildren","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                             ,0x87,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar_.message_);
                  gtest_ar_.success_ = true;
                  gtest_ar_._1_3_ = 0;
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                            ((internal *)&gtest_ar,"child1->mNumChildren","1u",&paVar1->mNumChildren
                             ,(uint *)&gtest_ar_);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar4 = "";
                    }
                    else {
                      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_60,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                               ,0x88,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
                    goto LAB_003685d9;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  paVar1 = *paVar1->mChildren;
                  gtest_ar_.message_.ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  gtest_ar_.success_ = paVar1 != (aiNode *)0x0;
                  if (gtest_ar_.success_) {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar_.message_);
                    testing::internal::CmpHelperSTREQ
                              ((internal *)&gtest_ar,"child10->mName.C_Str()",
                               "\"\\xd0\\x9a\\xd1\\x83\\xd0\\xb1\\x31\"\"001\"",(paVar1->mName).data
                               ,anon_var_dwarf_13a944);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&gtest_ar_);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_60,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                 ,0x8c,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
                      testing::internal::AssertHelper::~AssertHelper(&local_60);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar_);
                    }
                    this_00 = &gtest_ar.message_;
                    goto LAB_003685f5;
                  }
                  testing::Message::Message((Message *)&local_60);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"child10"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                             ,0x8b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
                }
              }
            }
          }
        }
      }
    }
  }
  this_00 = &gtest_ar_.message_;
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_60);
LAB_003685f5:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  Assimp::Importer::~Importer(&importer);
  return;
}

Assistant:

TEST_F(utFBXImporterExporter, importCubesWithUnicodeDuplicatedNames) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/FBX/cubes_with_names.fbx", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(scene);

    ASSERT_TRUE(scene->mRootNode);
    const auto root = scene->mRootNode;
    ASSERT_STREQ(root->mName.C_Str(), "RootNode");
    ASSERT_TRUE(root->mChildren);
    ASSERT_EQ(root->mNumChildren, 2u);

    const auto child0 = root->mChildren[0];
    ASSERT_TRUE(child0);
    ASSERT_STREQ(child0->mName.C_Str(), "Cube2");
    ASSERT_TRUE(child0->mChildren);
    ASSERT_EQ(child0->mNumChildren, 1u);

    const auto child00 = child0->mChildren[0];
    ASSERT_TRUE(child00);
    ASSERT_STREQ(child00->mName.C_Str(), "\xd0\x9a\xd1\x83\xd0\xb1\x31");

    const auto child1 = root->mChildren[1];
    ASSERT_TRUE(child1);
    ASSERT_STREQ(child1->mName.C_Str(), "Cube3");
    ASSERT_TRUE(child1->mChildren);
    ASSERT_EQ(child1->mNumChildren, 1u);

    const auto child10 = child1->mChildren[0];
    ASSERT_TRUE(child10);
    ASSERT_STREQ(child10->mName.C_Str(), "\xd0\x9a\xd1\x83\xd0\xb1\x31""001");
}